

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O2

void __thiscall amrex::STLtools::prepare(STLtools *this)

{
  XDim3 *pXVar1;
  XDim3 *d;
  double dVar2;
  double dVar3;
  size_type sVar4;
  pointer pTVar5;
  pointer pTVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  int iVar11;
  Real *pRVar12;
  ostream *poVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  bool bVar18;
  byte bVar19;
  uint uVar20;
  double *pdVar21;
  byte bVar22;
  undefined4 in_R10D;
  undefined3 uVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  gpu_tuple_impl<4UL,_double,_double> gVar30;
  undefined1 auVar31 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  undefined1 auVar32 [16];
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar53;
  undefined1 auVar52 [16];
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar61;
  undefined1 auVar60 [16];
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  double dVar67;
  undefined1 auVar68 [16];
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  ReduceOps<amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMin,_amrex::ReduceOpMax,_amrex::ReduceOpMax,_amrex::ReduceOpMax>
  reduce_op;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  double dStack_360;
  Type local_218;
  ReduceData<double,_double,_double,_double,_double,_double> reduce_data;
  undefined1 local_1b0 [392];
  double dVar66;
  
  if (*(int *)(ParallelContext::frames + 0xc) != 0) {
    PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
              (&this->m_tri_pts_h,(long)this->m_num_tri);
  }
  PODVector<amrex::STLtools::Triangle,_std::allocator<amrex::STLtools::Triangle>_>::resize
            (&this->m_tri_pts_d,(long)this->m_num_tri);
  PODVector<amrex::XDim3,_std::allocator<amrex::XDim3>_>::resize
            (&this->m_tri_normals_d,(long)this->m_num_tri);
  sVar4 = (this->m_tri_pts_h).m_size;
  if (sVar4 != 0) {
    memcpy((this->m_tri_pts_d).m_data,(this->m_tri_pts_h).m_data,sVar4 * 0x48);
  }
  pTVar5 = (this->m_tri_pts_d).m_data;
  iVar11 = this->m_num_tri;
  if (0 < (long)iVar11) {
    pRVar12 = &((this->m_tri_normals_d).m_data)->z;
    lVar15 = 0;
    do {
      dVar61 = *(double *)((long)&(pTVar5->v2).x + lVar15);
      pdVar21 = (double *)((long)&(pTVar5->v2).y + lVar15);
      dVar45 = *pdVar21;
      dVar59 = pdVar21[1];
      dVar54 = *(double *)((long)&(pTVar5->v3).y + lVar15) - dVar45;
      pdVar21 = (double *)((long)&(pTVar5->v1).y + lVar15);
      dVar36 = dVar61 - *(double *)((long)&(pTVar5->v1).x + lVar15);
      dVar45 = dVar45 - *pdVar21;
      dVar48 = dVar59 - pdVar21[1];
      dVar59 = *(double *)((long)&(pTVar5->v3).z + lVar15) - dVar59;
      dVar61 = *(double *)((long)&(pTVar5->v3).x + lVar15) - dVar61;
      dVar49 = dVar45 * dVar59 - dVar54 * dVar48;
      dVar59 = dVar48 * dVar61 - dVar59 * dVar36;
      dVar61 = dVar36 * dVar54 - dVar61 * dVar45;
      dVar45 = 1.0 / SQRT(dVar61 * dVar61 + dVar49 * dVar49 + dVar59 * dVar59);
      ((XDim3 *)(pRVar12 + -2))->x = dVar45 * dVar49;
      pRVar12[-1] = dVar45 * dVar59;
      *pRVar12 = dVar61 * dVar45;
      lVar15 = lVar15 + 0x48;
      pRVar12 = pRVar12 + 3;
    } while ((long)iVar11 * 0x48 - lVar15 != 0);
  }
  ReduceData<double,double,double,double,double,double>::
  ReduceData<amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMax,amrex::ReduceOpMax,amrex::ReduceOpMax>
            ((ReduceData<double,double,double,double,double,double> *)&reduce_data,&reduce_op);
  uVar14 = 0;
  uVar16 = (ulong)(uint)this->m_num_tri;
  if (this->m_num_tri < 1) {
    uVar16 = uVar14;
  }
  for (; uVar16 * 0x48 - uVar14 != 0; uVar14 = uVar14 + 0x48) {
    auVar63 = *(undefined1 (*) [16])((long)&(pTVar5->v2).y + uVar14);
    auVar65 = *(undefined1 (*) [16])((long)&(pTVar5->v1).y + uVar14);
    auVar31 = *(undefined1 (*) [16])((long)&(pTVar5->v3).y + uVar14);
    auVar42 = maxpd(auVar63,auVar65);
    auVar29 = maxpd(auVar31,auVar42);
    gVar30 = ((reduce_data.m_tuple.
               super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               .
               super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_impl<3UL,_double,_double,_double>.
             super_gpu_tuple_impl<4UL,_double,_double>;
    dVar36 = ((reduce_data.m_tuple.
               super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               .
               super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.
             m_value;
    dVar48 = ((reduce_data.m_tuple.
               super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               .
               super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_element<2UL,_double>.m_value;
    dVar61 = *(double *)((long)&(pTVar5->v2).x + uVar14);
    auVar68._8_8_ = dVar61;
    auVar68._0_8_ = auVar63._0_8_;
    dVar45 = *(double *)((long)&(pTVar5->v1).x + uVar14);
    auVar42._8_8_ = dVar45;
    auVar42._0_8_ = auVar65._0_8_;
    auVar42 = minpd(auVar68,auVar42);
    dVar59 = *(double *)((long)&(pTVar5->v3).x + uVar14);
    auVar76._8_8_ = dVar59;
    auVar76._0_8_ = auVar31._0_8_;
    auVar42 = minpd(auVar76,auVar42);
    auVar42 = minpd(auVar42,*(undefined1 (*) [16])
                             &((reduce_data.m_tuple.
                                super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                                .
                                super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>
                              ).super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
                              super_gpu_tuple_element<1UL,_double>);
    *(undefined1 (*) [16])
     &((reduce_data.m_tuple.
        super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        .
        super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
      super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
      super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
      super_gpu_tuple_element<1UL,_double> = auVar42;
    uVar24 = -(ulong)(auVar63._8_8_ < auVar65._8_8_);
    dVar61 = (double)(~-(ulong)(dVar45 < dVar61) & (ulong)dVar45 |
                     (ulong)dVar61 & -(ulong)(dVar45 < dVar61));
    dVar45 = (double)(~uVar24 & (ulong)auVar65._8_8_ | (ulong)auVar63._8_8_ & uVar24);
    uVar24 = -(ulong)(dVar61 < dVar59);
    uVar25 = -(ulong)(auVar31._8_8_ < dVar45);
    dVar61 = (double)(~uVar24 & (ulong)dVar61 | (ulong)dVar59 & uVar24);
    dVar45 = (double)(~uVar25 & (ulong)dVar45 | (ulong)auVar31._8_8_ & uVar25);
    uVar24 = -(ulong)(dVar36 < dVar61);
    uVar25 = -(ulong)(dVar45 < dVar48);
    ((reduce_data.m_tuple.
      super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      .
      super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
    super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
    super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
    super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.m_value =
         (double)(~uVar24 & (ulong)dVar36 | (ulong)dVar61 & uVar24);
    ((reduce_data.m_tuple.
      super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      .
      super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
    super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
    super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.super_gpu_tuple_element<2UL,_double>.
    m_value = (double)(~uVar25 & (ulong)dVar48 | (ulong)dVar45 & uVar25);
    auVar63._8_8_ = auVar29._0_8_;
    auVar63._0_8_ = auVar29._8_8_;
    gVar30 = (gpu_tuple_impl<4UL,_double,_double>)maxpd(auVar63,(undefined1  [16])gVar30);
    ((reduce_data.m_tuple.
      super_vector<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      .
      super__Vector_base<amrex::GpuTuple<double,_double,_double,_double,_double,_double>,_std::allocator<amrex::GpuTuple<double,_double,_double,_double,_double,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>).
    super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
    super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
    super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double> =
         gVar30;
  }
  ReduceOps<amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMin,amrex::ReduceOpMax,amrex::ReduceOpMax,amrex::ReduceOpMax>
  ::value<amrex::ReduceData<double,double,double,double,double,double>>
            (&local_218,&reduce_op,&reduce_data);
  pXVar1 = &this->m_ptmin;
  auVar65._0_8_ =
       local_218.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_element<0UL,_double>.m_value;
  auVar65._8_4_ =
       local_218.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_element<1UL,_double>.m_value._0_4_;
  auVar65._12_4_ =
       local_218.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_element<1UL,_double>.m_value._4_4_;
  (this->m_ptmin).x = (Real)auVar65._0_8_;
  (this->m_ptmin).y = (Real)auVar65._8_8_;
  d = &this->m_ptmax;
  auVar31._0_8_ =
       local_218.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_element<2UL,_double>.m_value;
  auVar31._8_4_ =
       local_218.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.
       m_value._0_4_;
  auVar31._12_4_ =
       local_218.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_element<3UL,_double>.
       m_value._4_4_;
  *(undefined1 (*) [16])&(this->m_ptmin).z = auVar31;
  (this->m_ptmax).y =
       local_218.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
       super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
       super_gpu_tuple_impl<3UL,_double,_double,_double>.super_gpu_tuple_impl<4UL,_double,_double>.
       super_gpu_tuple_element<4UL,_double>.m_value;
  (this->m_ptmax).z =
       (Real)local_218.super_gpu_tuple_impl<0UL,_double,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<1UL,_double,_double,_double,_double,_double>.
             super_gpu_tuple_impl<2UL,_double,_double,_double,_double>.
             super_gpu_tuple_impl<3UL,_double,_double,_double>.
             super_gpu_tuple_impl<4UL,_double,_double>.super_gpu_tuple_impl<5UL,_double>.
             super_gpu_tuple_element<5UL,_double>.m_value;
  iVar11 = Verbose();
  if (0 < iVar11) {
    poVar13 = OutStream();
    Print::Print((Print *)local_1b0,poVar13);
    poVar13 = (ostream *)(local_1b0 + 0x10);
    std::operator<<(poVar13,"    Min: ");
    operator<<<amrex::XDim3,_nullptr>(poVar13,pXVar1);
    std::operator<<(poVar13," Max: ");
    operator<<<amrex::XDim3,_nullptr>(poVar13,d);
    std::endl<char,std::char_traits<char>>(poVar13);
    Print::~Print((Print *)local_1b0);
  }
  pTVar6 = (this->m_tri_pts_h).m_data;
  dVar61 = (pTVar6->v1).x;
  dVar45 = (pTVar6->v2).x;
  dVar67 = dVar45 - dVar61;
  dVar59 = (pTVar6->v1).y;
  dVar36 = (pTVar6->v1).z;
  dVar48 = (pTVar6->v2).y;
  dVar49 = (pTVar6->v2).z;
  dVar54 = (pTVar6->v3).x;
  dVar37 = (pTVar6->v3).y;
  auVar29._0_8_ = dVar45 + dVar61 + dVar54;
  auVar29._8_8_ = dVar48 + dVar59 + dVar37;
  auVar63 = divpd(auVar29,_DAT_00703440);
  dVar66 = auVar63._8_8_;
  dVar61 = (pTVar6->v3).z;
  dVar59 = dVar48 - dVar59;
  dVar56 = dVar49 - dVar36;
  dVar37 = dVar37 - dVar48;
  dVar57 = dVar61 - dVar49;
  dVar54 = dVar54 - dVar45;
  dVar48 = dVar59 * dVar57 - dVar37 * dVar56;
  dVar56 = dVar56 * dVar54 - dVar57 * dVar67;
  dVar54 = dVar67 * dVar37 - dVar54 * dVar59;
  dVar45 = 1.0 / SQRT(dVar54 * dVar54 + dVar48 * dVar48 + dVar56 * dVar56);
  dVar48 = dVar45 * dVar48;
  dVar56 = dVar45 * dVar56;
  dVar59 = auVar63._0_8_;
  if (dVar48 <= 2.220446049250313e-16) {
    if (dVar48 < -2.220446049250313e-16) {
      dVar37 = pXVar1->x;
      goto LAB_006d8112;
    }
    local_1b0._0_8_ = 1.79769313486232e+308;
  }
  else {
    dVar37 = d->x;
LAB_006d8112:
    local_1b0._0_8_ = (dVar37 - dVar59) / dVar48;
  }
  dVar54 = dVar54 * dVar45;
  if (dVar56 <= 2.220446049250313e-16) {
    if (dVar56 < -2.220446049250313e-16) {
      dVar45 = (this->m_ptmin).y;
      goto LAB_006d8161;
    }
    local_1b0._8_8_ = (ostream *)0x7fefffffffffffff;
  }
  else {
    dVar45 = (this->m_ptmax).y;
LAB_006d8161:
    local_1b0._8_8_ = (dVar45 - dVar66) / dVar56;
  }
  dVar61 = (dVar36 + dVar49 + dVar61) / 3.0;
  if (dVar54 <= 2.220446049250313e-16) {
    if (dVar54 < -2.220446049250313e-16) {
      dVar45 = (this->m_ptmin).z;
      goto LAB_006d81d2;
    }
    local_1b0._16_8_ = 1.79769313486232e+308;
  }
  else {
    dVar45 = (this->m_ptmax).z;
LAB_006d81d2:
    local_1b0._16_8_ = (dVar45 - dVar61) / dVar54;
  }
  __l._M_len = 3;
  __l._M_array = (iterator)local_1b0;
  dVar45 = std::min<double>(__l);
  if (dVar48 <= 2.220446049250313e-16) {
    if (dVar48 < -2.220446049250313e-16) {
      dVar36 = d->x;
      goto LAB_006d824e;
    }
    local_1b0._0_8_ = -1.79769313486232e+308;
  }
  else {
    dVar36 = pXVar1->x;
LAB_006d824e:
    local_1b0._0_8_ = (dVar36 - dVar59) / dVar48;
  }
  if (dVar56 <= 2.220446049250313e-16) {
    if (dVar56 < -2.220446049250313e-16) {
      dVar36 = (this->m_ptmax).y;
      goto LAB_006d828d;
    }
    local_1b0._8_8_ = (ostream *)0xffefffffffffffff;
  }
  else {
    dVar36 = (this->m_ptmin).y;
LAB_006d828d:
    local_1b0._8_8_ = (dVar36 - dVar66) / dVar56;
  }
  if (dVar54 <= 2.220446049250313e-16) {
    if (-2.220446049250313e-16 <= dVar54) {
      local_1b0._16_8_ = -1.79769313486232e+308;
      goto LAB_006d82de;
    }
    dVar36 = (this->m_ptmax).z;
  }
  else {
    dVar36 = (this->m_ptmin).z;
  }
  local_1b0._16_8_ = (dVar36 - dVar61) / dVar54;
LAB_006d82de:
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_1b0;
  dVar49 = std::max<double>(__l_00);
  dVar37 = -dVar49;
  dVar36 = dVar37;
  if (dVar37 <= dVar45) {
    dVar36 = dVar45;
  }
  if (dVar37 <= dVar45) {
    dVar49 = dVar49 - dVar36 * 0.009;
  }
  else {
    dVar49 = dVar45 + dVar36 * 0.009;
  }
  dVar54 = (double)(~-(ulong)(ABS(dVar54) < 1e-05) & (ulong)dVar54 |
                   ((ulong)dVar54 & 0x8000000000000000 | 0x3ee4f8b588e368f1) &
                   -(ulong)(ABS(dVar54) < 1e-05)) * dVar49 + dVar61;
  dVar48 = dVar49 * (double)(~-(ulong)(ABS(dVar48) < 1e-05) & (ulong)dVar48 |
                            ((ulong)dVar48 & 0x8000000000000000 | 0x3ee4f8b588e368f1) &
                            -(ulong)(ABS(dVar48) < 1e-05)) + dVar59;
  dVar49 = dVar49 * (double)(~-(ulong)(ABS(dVar56) < 1e-05) & (ulong)dVar56 |
                            ((ulong)dVar56 & 0x8000000000000000 | 0x3ee4f8b588e368f1) &
                            -(ulong)(ABS(dVar56) < 1e-05)) + dVar66;
  (this->m_ptref).x = dVar48;
  (this->m_ptref).y = dVar49;
  (this->m_ptref).z = dVar54;
  dVar36 = dVar59;
  if (dVar59 <= dVar48) {
    dVar36 = dVar48;
  }
  dVar56 = dVar59;
  if (dVar48 <= dVar59) {
    dVar56 = dVar48;
  }
  dVar57 = dVar66;
  if (dVar66 <= dVar49) {
    dVar57 = dVar49;
  }
  dVar67 = dVar66;
  if (dVar49 <= dVar66) {
    dVar67 = dVar49;
  }
  dVar38 = dVar61;
  if (dVar61 <= dVar54) {
    dVar38 = dVar54;
  }
  dVar39 = dVar61;
  if (dVar54 <= dVar61) {
    dVar39 = dVar54;
  }
  dVar73 = dVar48 * dVar66 - dVar59 * dVar49;
  dVar78 = dVar48 * dVar61 - dVar59 * dVar54;
  dVar79 = dVar48 - dVar59;
  dVar85 = dVar49 * dVar61 - dVar66 * dVar54;
  dVar40 = dVar54 - dVar61;
  dVar62 = dVar66 - dVar49;
  dVar50 = -dVar61;
  uVar14 = 0;
  uVar16 = (ulong)(uint)this->m_num_tri;
  if (this->m_num_tri < 1) {
    uVar16 = uVar14;
  }
  bVar17 = 0;
  auVar43._8_4_ = SUB84(dVar61,0);
  auVar43._0_8_ = dVar50;
  auVar43._12_4_ = (int)((ulong)dVar50 >> 0x20);
  do {
    if (uVar16 * 0x48 - uVar14 == 0) {
      this->m_boundry_is_outside = (bool)(~bVar17 & 1);
      ReduceData<double,_double,_double,_double,_double,_double>::~ReduceData(&reduce_data);
      return;
    }
    bVar18 = dVar37 <= dVar45;
    if (uVar14 == 0) goto LAB_006d86dc;
    dVar70 = *(double *)((long)&(pTVar5->v1).x + uVar14);
    dVar51 = *(double *)((long)&(pTVar5->v2).x + uVar14);
    dVar72 = *(double *)((long)&(pTVar5->v3).x + uVar14);
    dVar75 = dVar51;
    if (dVar70 <= dVar51) {
      dVar75 = dVar70;
    }
    dVar53 = dVar72;
    if (dVar75 <= dVar72) {
      dVar53 = dVar75;
    }
    if (dVar36 < dVar53) {
LAB_006d86da:
      bVar18 = false;
    }
    else {
      dVar75 = dVar51;
      pTVar6 = (pointer)&pTVar5->v2;
      if (dVar51 <= dVar70) {
        dVar75 = dVar70;
        pTVar6 = pTVar5;
      }
      if (dVar75 < dVar72) {
        pTVar6 = (pointer)&pTVar5->v3;
      }
      pdVar21 = (double *)((long)&(pTVar6->v1).x + uVar14);
      if (*pdVar21 <= dVar56 && dVar56 != *pdVar21) goto LAB_006d86da;
      dVar75 = *(double *)((long)&(pTVar5->v1).y + uVar14);
      dVar53 = *(double *)((long)&(pTVar5->v2).y + uVar14);
      dVar77 = *(double *)((long)&(pTVar5->v3).y + uVar14);
      dVar2 = dVar53;
      if (dVar75 <= dVar53) {
        dVar2 = dVar75;
      }
      dVar83 = dVar77;
      if (dVar2 <= dVar77) {
        dVar83 = dVar2;
      }
      if (dVar57 < dVar83) goto LAB_006d86da;
      dVar2 = dVar53;
      pXVar1 = &pTVar5->v2;
      if (dVar53 <= dVar75) {
        dVar2 = dVar75;
        pXVar1 = &pTVar5->v1;
      }
      if (dVar2 < dVar77) {
        pXVar1 = &pTVar5->v3;
      }
      pdVar21 = (double *)((long)&pXVar1->y + uVar14);
      if (*pdVar21 <= dVar67 && dVar67 != *pdVar21) goto LAB_006d86da;
      dVar2 = *(double *)((long)&(pTVar5->v1).z + uVar14);
      dVar83 = *(double *)((long)&(pTVar5->v2).z + uVar14);
      dVar3 = *(double *)((long)&(pTVar5->v3).z + uVar14);
      dVar26 = dVar83;
      if (dVar2 <= dVar83) {
        dVar26 = dVar2;
      }
      dVar27 = dVar3;
      if (dVar26 <= dVar3) {
        dVar27 = dVar26;
      }
      if (dVar38 < dVar27) {
LAB_006d875c:
        bVar18 = false;
      }
      else {
        dVar26 = dVar83;
        pXVar1 = &pTVar5->v2;
        if (dVar83 <= dVar2) {
          dVar26 = dVar2;
          pXVar1 = &pTVar5->v1;
        }
        if (dVar26 < dVar3) {
          pXVar1 = &pTVar5->v3;
        }
        pdVar21 = (double *)((long)&pXVar1->z + uVar14);
        if (*pdVar21 <= dVar39 && dVar39 != *pdVar21) goto LAB_006d875c;
        dVar33 = dVar51 - dVar72;
        dVar34 = dVar83 - dVar3;
        dVar81 = dVar53 - dVar75;
        dVar84 = dVar75 - dVar77;
        dVar74 = dVar77 - dVar53;
        dVar26 = dVar72 * dVar75 - dVar70 * dVar77;
        dVar27 = dVar72 * dVar2 - dVar70 * dVar3;
        dVar55 = dVar77 * dVar2 - dVar75 * dVar3;
        dVar28 = dVar70 * dVar53 - dVar51 * dVar75;
        dVar35 = dVar51 * dVar77 - dVar72 * dVar53;
        dVar88 = dVar51 * dVar3 - dVar72 * dVar83;
        dVar58 = dVar3 * dVar53 - dVar77 * dVar83;
        dVar69 = dVar62 * (dVar70 * dVar83 - dVar51 * dVar2) +
                 dVar40 * dVar28 +
                 dVar85 * (dVar70 - dVar51) +
                 dVar79 * (dVar83 * dVar75 - dVar53 * dVar2) +
                 dVar73 * (dVar2 - dVar83) + dVar78 * dVar81;
        dVar71 = dVar62 * dVar88 +
                 dVar40 * dVar35 +
                 dVar85 * dVar33 + dVar79 * dVar58 + dVar73 * dVar34 + dVar78 * dVar74;
        dVar46 = dVar3 - dVar2;
        dVar47 = dVar72 - dVar70;
        dVar41 = dVar62 * dVar27 +
                 dVar40 * dVar26 +
                 dVar85 * dVar47 + dVar79 * dVar55 + dVar73 * dVar46 + dVar78 * dVar84;
        auVar7._8_8_ = -(ulong)(ABS(dVar71) < 2.220446049250313e-16);
        auVar7._0_8_ = -(ulong)(ABS(dVar69) < 2.220446049250313e-16);
        uVar20 = movmskpd((int)pdVar21,auVar7);
        bVar19 = (byte)uVar20;
        dVar86 = ABS(dVar41);
        bVar22 = dVar86 < 2.220446049250313e-16 & bVar19 >> 1;
        if (((uVar20 & 1) != 0) && (bVar22 != 0)) {
          dVar28 = dVar51 - dVar70;
          dVar33 = dVar70 - dVar72;
          dVar58 = dVar83 - dVar2;
          dVar69 = dVar2 - dVar3;
          dVar80 = dVar72 - dVar51;
          dVar82 = dVar3 - dVar83;
          dVar86 = dVar28 * (dVar49 - dVar75) + -dVar81 * (dVar48 - dVar70);
          dVar88 = dVar80 * (dVar49 - dVar53) + -dVar74 * (dVar48 - dVar51);
          dVar87 = dVar81 * (dVar54 - dVar2) + -dVar58 * (dVar49 - dVar75);
          dVar89 = dVar74 * (dVar54 - dVar83) + -dVar82 * (dVar49 - dVar53);
          dVar34 = dVar58 * (dVar48 - dVar70) + -dVar28 * (dVar54 - dVar2);
          dVar41 = dVar82 * (dVar48 - dVar51) + -dVar80 * (dVar54 - dVar83);
          dVar35 = dVar81 * dVar46 - (dVar77 - dVar75) * dVar58;
          dVar55 = dVar84 * (dVar54 - dVar3) - (dVar49 - dVar77) * dVar69;
          dVar46 = dVar58 * dVar47 - dVar46 * dVar28;
          dVar71 = dVar69 * (dVar48 - dVar72) - (dVar54 - dVar3) * dVar33;
          auVar64._0_8_ = dVar47 * dVar81;
          auVar64._8_8_ = (dVar48 - dVar72) * dVar84;
          dVar26 = dVar28 * (dVar77 - dVar75) - auVar64._0_8_;
          dVar27 = dVar33 * (dVar49 - dVar77) - auVar64._8_8_;
          auVar60._0_8_ = dVar46 * dVar46;
          auVar60._8_8_ = dVar71 * dVar71;
          auVar9._8_8_ = dVar88 * dVar88 + dVar89 * dVar89 + dVar41 * dVar41;
          auVar9._0_8_ = dVar86 * dVar86 + dVar87 * dVar87 + dVar34 * dVar34;
          auVar65 = sqrtpd(auVar64,auVar9);
          auVar44._0_8_ = dVar26 * dVar26 + dVar35 * dVar35 + auVar60._0_8_;
          auVar44._8_8_ = dVar27 * dVar27 + dVar55 * dVar55 + auVar60._8_8_;
          auVar63 = sqrtpd(auVar60,auVar44);
          dVar26 = auVar63._0_8_ * 0.5;
          if ((2.220446049250313e-16 <
               ABS((auVar63._8_8_ * 0.5 + auVar65._8_8_ * 0.5 + auVar65._0_8_ * 0.5) - dVar26)) ||
             (dVar34 = dVar80 * (dVar66 - dVar53) + -dVar74 * (dVar59 - dVar51),
             dVar27 = dVar74 * (dVar61 - dVar83) + (dVar66 - dVar53) * -dVar82,
             dVar83 = dVar82 * (dVar59 - dVar51) + (dVar61 - dVar83) * -dVar80,
             dVar51 = dVar28 * (dVar66 - dVar75) + -dVar81 * (dVar59 - dVar70),
             dVar53 = dVar33 * (dVar66 - dVar77) + -dVar84 * (dVar59 - dVar72),
             dVar75 = dVar81 * (dVar61 - dVar2) + (dVar66 - dVar75) * -dVar58,
             dVar77 = dVar84 * (dVar61 - dVar3) + (dVar66 - dVar77) * -dVar69,
             dVar70 = dVar58 * (dVar59 - dVar70) + (dVar61 - dVar2) * -dVar28,
             dVar72 = dVar69 * (dVar59 - dVar72) + (dVar61 - dVar3) * -dVar33,
             auVar52._0_8_ = dVar51 * dVar51 + dVar75 * dVar75 + dVar70 * dVar70,
             auVar52._8_8_ = dVar53 * dVar53 + dVar77 * dVar77 + dVar72 * dVar72,
             auVar63 = sqrtpd(auVar52,auVar52),
             2.220446049250313e-16 <
             ABS((auVar63._8_8_ * 0.5 +
                 SQRT(dVar34 * dVar34 + dVar27 * dVar27 + dVar83 * dVar83) * 0.5 +
                 auVar63._0_8_ * 0.5) - dVar26))) {
            bVar18 = true;
          }
          else {
            bVar18 = false;
          }
          goto LAB_006d86dc;
        }
        dVar77 = -dVar2;
        uStack_514 = (undefined4)((ulong)dVar28 >> 0x20);
        uStack_510 = SUB84(dVar35,0);
        uStack_50c = (undefined4)((ulong)dVar35 >> 0x20);
        auVar10._4_8_ = dVar88;
        auVar10._0_4_ = uStack_514;
        auVar32._0_8_ = auVar10._0_8_ << 0x20;
        auVar32._8_4_ = uStack_510;
        auVar32._12_4_ = uStack_50c;
        dVar72 = auVar32._8_8_;
        if (((0.0 <= dVar41) || (0.0 <= dVar69)) || (0.0 <= dVar71)) {
          auVar8._8_8_ = -(ulong)(0.0 < dVar71);
          auVar8._0_8_ = -(ulong)(0.0 < dVar69);
          iVar11 = movmskpd(in_R10D,auVar8);
          uVar23 = (undefined3)((uint)iVar11 >> 8);
          in_R10D = CONCAT31(uVar23,iVar11 == 3);
          if ((((0.0 < dVar41) && (iVar11 == 3)) ||
              ((bVar18 = 0.0 < dVar71 * dVar41, in_R10D = CONCAT31(uVar23,bVar18),
               (bVar19 & bVar18) != 0 ||
               (bVar18 = 0.0 < dVar41 * dVar69, in_R10D = CONCAT31(uVar23,bVar18),
               (bVar19 >> 1 & bVar18) != 0)))) ||
             ((dVar86 < 2.220446049250313e-16 && (0.0 < dVar71 * dVar69)))) goto LAB_006d8fa0;
          if ((uVar20 & 1) != 0) {
            if (bVar19 >> 1 == 0) {
              if (dVar86 < 2.220446049250313e-16) {
                dStack_360 = auVar43._8_8_;
                bVar18 = 0.0 < (dVar84 * (dVar59 * dVar83 + dVar51 * dStack_360) +
                               dVar46 * (dVar59 * dVar53 + -dVar66 * dVar51) +
                               dVar55 * (dVar59 - dVar51) +
                               dVar47 * (dVar66 * dVar83 + dStack_360 * dVar53) +
                               dVar26 * (dVar61 - dVar83) + dVar27 * (dVar53 - dVar66)) *
                               (dVar84 * (dVar51 * dVar54 + dVar48 * -dVar83) +
                               dVar46 * (dVar51 * dVar49 + -dVar53 * dVar48) +
                               dVar55 * (dVar51 - dVar48) +
                               dVar47 * (dVar53 * dVar54 + -dVar83 * dVar49) +
                               dVar26 * (dVar83 - dVar54) + dVar27 * (dVar49 - dVar53));
              }
              else {
                bVar18 = false;
              }
              goto LAB_006d86dc;
            }
LAB_006d929b:
            dVar70 = (dVar74 * (dVar59 * dVar2 + dVar70 * dVar50) +
                     dVar34 * (dVar59 * dVar75 + -dVar66 * dVar70) +
                     dVar58 * (dVar59 - dVar70) +
                     dVar33 * (dVar66 * dVar2 + dVar50 * dVar75) +
                     dVar72 * (dVar61 - dVar2) + (dVar75 - dVar66) * dVar88) *
                     (dVar74 * (dVar70 * dVar54 + dVar48 * dVar77) +
                     dVar34 * (dVar70 * dVar49 + -dVar75 * dVar48) +
                     dVar58 * (dVar70 - dVar48) +
                     dVar33 * (dVar75 * dVar54 + dVar77 * dVar49) +
                     dVar72 * (dVar2 - dVar54) + (dVar49 - dVar75) * dVar88);
            goto code_r0x006d90b4;
          }
          if (bVar22 != 0) goto LAB_006d929b;
          bVar18 = false;
        }
        else {
LAB_006d8fa0:
          dVar70 = (dVar74 * (dVar48 * dVar2 + dVar70 * -dVar54) +
                   dVar34 * (dVar48 * dVar75 + -dVar49 * dVar70) +
                   dVar58 * (dVar48 - dVar70) +
                   dVar33 * (dVar49 * dVar2 + -dVar54 * dVar75) +
                   dVar72 * (dVar54 - dVar2) + (dVar75 - dVar49) * dVar88) *
                   (dVar74 * (dVar70 * dVar61 + dVar59 * dVar77) +
                   dVar34 * (dVar70 * dVar66 + -dVar75 * dVar59) +
                   dVar58 * (dVar70 - dVar59) +
                   dVar33 * (dVar75 * dVar61 + dVar77 * dVar66) +
                   dVar72 * (dVar2 - dVar61) + (dVar66 - dVar75) * dVar88);
code_r0x006d90b4:
          bVar18 = 0.0 < dVar70;
        }
      }
    }
LAB_006d86dc:
    bVar17 = bVar17 + bVar18;
    uVar14 = uVar14 + 0x48;
  } while( true );
}

Assistant:

void
STLtools::prepare ()
{
    ParallelDescriptor::Bcast(&m_num_tri, 1);
    if (!ParallelDescriptor::IOProcessor()) {
        m_tri_pts_h.resize(m_num_tri);
    }

    //device vectors
    m_tri_pts_d.resize(m_num_tri);
    m_tri_normals_d.resize(m_num_tri);

    Gpu::copyAsync(Gpu::hostToDevice, m_tri_pts_h.begin(), m_tri_pts_h.end(),
                   m_tri_pts_d.begin());

    Triangle const* tri_pts = m_tri_pts_d.data();
    XDim3* tri_norm = m_tri_normals_d.data();

    // Compute normals in case the STL file does not have valid data for normals
    ParallelFor(m_num_tri, [=] AMREX_GPU_DEVICE (int i) noexcept
    {
        Triangle const& tri = tri_pts[i];
        XDim3 vec1{tri.v2.x-tri.v1.x, tri.v2.y-tri.v1.y, tri.v2.z-tri.v1.z};
        XDim3 vec2{tri.v3.x-tri.v2.x, tri.v3.y-tri.v2.y, tri.v3.z-tri.v2.z};
        XDim3 norm{vec1.y*vec2.z-vec1.z*vec2.y,
                   vec1.z*vec2.x-vec1.x*vec2.z,
                   vec1.x*vec2.y-vec1.y*vec2.x};
        Real tmp = 1._rt / std::sqrt(norm.x*norm.x + norm.y*norm.y + norm.z*norm.z);
        tri_norm[i].x = norm.x * tmp;
        tri_norm[i].y = norm.y * tmp;
        tri_norm[i].z = norm.z * tmp;
    });

    ReduceOps<ReduceOpMin,ReduceOpMin,ReduceOpMin,ReduceOpMax,ReduceOpMax,ReduceOpMax> reduce_op;
    ReduceData<Real,Real,Real,Real,Real,Real> reduce_data(reduce_op);
    using ReduceTuple = typename decltype(reduce_data)::Type;
    reduce_op.eval(m_num_tri, reduce_data,
                   [=] AMREX_GPU_DEVICE (int i) -> ReduceTuple
                   {
                       return {amrex::min(tri_pts[i].v1.x,
                                          tri_pts[i].v2.x,
                                          tri_pts[i].v3.x),
                               amrex::min(tri_pts[i].v1.y,
                                          tri_pts[i].v2.y,
                                          tri_pts[i].v3.y),
                               amrex::min(tri_pts[i].v1.z,
                                          tri_pts[i].v2.z,
                                          tri_pts[i].v3.z),
                               amrex::max(tri_pts[i].v1.x,
                                          tri_pts[i].v2.x,
                                          tri_pts[i].v3.x),
                               amrex::max(tri_pts[i].v1.y,
                                          tri_pts[i].v2.y,
                                          tri_pts[i].v3.y),
                               amrex::max(tri_pts[i].v1.z,
                                          tri_pts[i].v2.z,
                                          tri_pts[i].v3.z)};
                   });
    auto const& hv = reduce_data.value(reduce_op);
    m_ptmin.x = amrex::get<0>(hv);
    m_ptmin.y = amrex::get<1>(hv);
    m_ptmin.z = amrex::get<2>(hv);
    m_ptmax.x = amrex::get<3>(hv);
    m_ptmax.y = amrex::get<4>(hv);
    m_ptmax.z = amrex::get<5>(hv);

    if (amrex::Verbose() > 0) {
        amrex::Print() << "    Min: " << m_ptmin << " Max: " << m_ptmax << std::endl;
    }

    // Choose a reference point by extending the normal vector of the first
    // triangle until it's slightly outside the bounding box.
    XDim3 cent0; // centroid of the first triangle
    int is_ref_positive;
    {
        Triangle const& tri = m_tri_pts_h[0];
        cent0 = XDim3{(tri.v1.x + tri.v2.x + tri.v3.x) / 3._rt,
                      (tri.v1.y + tri.v2.y + tri.v3.y) / 3._rt,
                      (tri.v1.z + tri.v2.z + tri.v3.z) / 3._rt};
        // We are computing the normal ourselves in case the stl file does
        // not have valid data on normal.
        XDim3 vec1{tri.v2.x-tri.v1.x, tri.v2.y-tri.v1.y, tri.v2.z-tri.v1.z};
        XDim3 vec2{tri.v3.x-tri.v2.x, tri.v3.y-tri.v2.y, tri.v3.z-tri.v2.z};
        XDim3 norm{vec1.y*vec2.z-vec1.z*vec2.y,
                   vec1.z*vec2.x-vec1.x*vec2.z,
                   vec1.x*vec2.y-vec1.y*vec2.x};
        Real tmp = 1._rt / std::sqrt(norm.x*norm.x + norm.y*norm.y + norm.z*norm.z);
        norm.x *= tmp;
        norm.y *= tmp;
        norm.z *= tmp;
        // Now we need to find out where the normal vector will intersect
        // with the bounding box defined by m_ptmin and m_ptmax.
        Real Lx, Ly, Lz;
        constexpr Real eps = std::numeric_limits<Real>::epsilon();
        if (norm.x > eps) {
            Lx = (m_ptmax.x-cent0.x) / norm.x;
        } else if (norm.x < -eps) {
            Lx = (m_ptmin.x-cent0.x) / norm.x;
        } else {
            Lx = std::numeric_limits<Real>::max();
        }
        if (norm.y > eps) {
            Ly = (m_ptmax.y-cent0.y) / norm.y;
        } else if (norm.y < -eps) {
            Ly = (m_ptmin.y-cent0.y) / norm.y;
        } else {
            Ly = std::numeric_limits<Real>::max();
        }
        if (norm.z > eps) {
            Lz = (m_ptmax.z-cent0.z) / norm.z;
        } else if (norm.z < -eps) {
            Lz = (m_ptmin.z-cent0.z) / norm.z;
        } else {
            Lz = std::numeric_limits<Real>::max();
        }
        Real Lp = std::min({Lx,Ly,Lz});
        if (norm.x > eps) {
            Lx = (m_ptmin.x-cent0.x) / norm.x;
        } else if (norm.x < -eps) {
            Lx = (m_ptmax.x-cent0.x) / norm.x;
        } else {
            Lx = std::numeric_limits<Real>::lowest();
        }
        if (norm.y > eps) {
            Ly = (m_ptmin.y-cent0.y) / norm.y;
        } else if (norm.y < -eps) {
            Ly = (m_ptmax.y-cent0.y) / norm.y;
        } else {
            Ly = std::numeric_limits<Real>::lowest();
        }
        if (norm.z > eps) {
            Lz = (m_ptmin.z-cent0.z) / norm.z;
        } else if (norm.z < -eps) {
            Lz = (m_ptmax.z-cent0.z) / norm.z;
        } else {
            Lz = std::numeric_limits<Real>::lowest();
        }
        if (std::abs(norm.x) < 1.e-5) {
            norm.x = std::copysign(1.e-5, norm.x);
        }
        if (std::abs(norm.y) < 1.e-5) {
            norm.y = std::copysign(1.e-5, norm.y);
        }
        if (std::abs(norm.z) < 1.e-5) {
            norm.z = std::copysign(1.e-5, norm.z);
        }
        Real Lm = std::max({Lx,Ly,Lz});
        Real Leps = std::max(Lp,-Lm) * 0.009;
        if (Lp < -Lm) {
            m_ptref.x = cent0.x + (Lp+Leps) * norm.x;
            m_ptref.y = cent0.y + (Lp+Leps) * norm.y;
            m_ptref.z = cent0.z + (Lp+Leps) * norm.z;
            is_ref_positive = true;
        } else {
            m_ptref.x = cent0.x + (Lm-Leps) * norm.x;
            m_ptref.y = cent0.y + (Lm-Leps) * norm.y;
            m_ptref.z = cent0.z + (Lm-Leps) * norm.z;
            is_ref_positive = false;
        }
    }

    // We now need to figure out if the boundary and the reference is
    // outside or inside the object.
    XDim3 ptref = m_ptref;
    int num_isects = Reduce::Sum<int>(m_num_tri, [=] AMREX_GPU_DEVICE (int i) -> int
        {
            if (i == 0) {
                return 1-is_ref_positive;
            } else {
                Real p1[] = {ptref.x, ptref.y, ptref.z};
                Real p2[] = {cent0.x, cent0.y, cent0.z};
                return static_cast<int>(line_tri_intersects(p1, p2, tri_pts[i]));
            }
        });

    m_boundry_is_outside = num_isects % 2 == 0;
}